

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclStructConstructors<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  ulong *puVar3;
  undefined1 *puVar4;
  TestError *pTVar5;
  size_type *psVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  string *psVar11;
  size_t dimension_index;
  string shader_source;
  string example_structure_object;
  string example_structure_definition;
  long *local_f0 [2];
  long local_e0 [2];
  string local_d0;
  string local_b0;
  long *local_90 [2];
  long local_80 [2];
  string base_variable_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  example_structure_definition._M_dataplus._M_p = (pointer)&example_structure_definition.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&example_structure_definition,
             "struct light {\n    float intensity;\n    int position;\n};\n","");
  example_structure_object._M_dataplus._M_p = (pointer)&example_structure_object.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&example_structure_object,"    light my_light_variable","");
  paVar1 = &shader_source.field_2;
  dimension_index = 2;
  do {
    local_f0[0] = local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_f0,example_structure_object._M_dataplus._M_p,
               example_structure_object._M_dataplus._M_p + example_structure_object._M_string_length
              );
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"[]","");
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[6])(&base_variable_string,this,local_f0,(string *)local_90,dimension_index);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    if (local_f0[0] != local_e0) {
      operator_delete(local_f0[0],local_e0[0] + 1);
    }
    std::__cxx11::string::append((char *)&base_variable_string);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"light","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1.0, 2","");
    recursively_initialise(&shader_source,this,&local_b0,dimension_index,&local_d0);
    std::__cxx11::string::_M_append
              ((char *)&base_variable_string,(ulong)shader_source._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)shader_source._M_dataplus._M_p != paVar1) {
      operator_delete(shader_source._M_dataplus._M_p,shader_source.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&base_variable_string);
    std::operator+(&local_50,&example_structure_definition,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &shader_start_abi_cxx11_);
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_50,(ulong)base_variable_string._M_dataplus._M_p);
    psVar6 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar6) {
      shader_source.field_2._M_allocated_capacity = *psVar6;
      shader_source.field_2._8_8_ = plVar2[3];
      shader_source._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      shader_source.field_2._M_allocated_capacity = *psVar6;
      shader_source._M_dataplus._M_p = (pointer)*plVar2;
    }
    shader_source._M_string_length = plVar2[1];
    *plVar2 = (long)psVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    puVar3 = &set_tesseation_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
    case COMPUTE_SHADER_TYPE:
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::append((char *)&shader_source);
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar3 = &emit_quad_abi_cxx11_;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::_M_append((char *)&shader_source,*puVar3);
      break;
    default:
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x9fe);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
    puVar9 = empty_string_abi_cxx11_;
    puVar8 = empty_string_abi_cxx11_;
    puVar7 = empty_string_abi_cxx11_;
    puVar10 = empty_string_abi_cxx11_;
    puVar4 = (undefined1 *)&shader_source;
    psVar11 = (string *)empty_string_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      puVar4 = empty_string_abi_cxx11_;
      puVar9 = default_vertex_shader_source_abi_cxx11_;
      puVar8 = default_tc_shader_source_abi_cxx11_;
      puVar7 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
      puVar10 = default_geometry_shader_source_abi_cxx11_;
      psVar11 = &shader_source;
      break;
    case VERTEX_SHADER_TYPE:
      puVar8 = default_tc_shader_source_abi_cxx11_;
      puVar9 = (undefined1 *)&shader_source;
      goto LAB_00b59d2b;
    case COMPUTE_SHADER_TYPE:
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar9 = default_vertex_shader_source_abi_cxx11_;
      puVar8 = default_tc_shader_source_abi_cxx11_;
      puVar7 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
      puVar10 = (undefined1 *)&shader_source;
      goto LAB_00b59d6c;
    case TESSELATION_CONTROL_SHADER_TYPE:
      puVar8 = (undefined1 *)&shader_source;
      puVar9 = default_vertex_shader_source_abi_cxx11_;
LAB_00b59d2b:
      puVar7 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
LAB_00b59d65:
      puVar10 = default_geometry_shader_source_abi_cxx11_;
LAB_00b59d6c:
      puVar4 = empty_string_abi_cxx11_;
      psVar11 = (string *)default_fragment_shader_source_abi_cxx11_;
      break;
    case TESSELATION_EVALUATION_SHADER_TYPE:
      puVar9 = default_vertex_shader_source_abi_cxx11_;
      puVar8 = default_tc_shader_source_abi_cxx11_;
      puVar7 = (undefined1 *)&shader_source;
      goto LAB_00b59d65;
    default:
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xa01);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])(this,puVar9,puVar8,puVar7,puVar10,psVar11,puVar4,1,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)shader_source._M_dataplus._M_p != paVar1) {
      operator_delete(shader_source._M_dataplus._M_p,shader_source.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)base_variable_string._M_dataplus._M_p != &base_variable_string.field_2) {
      operator_delete(base_variable_string._M_dataplus._M_p,
                      base_variable_string.field_2._M_allocated_capacity + 1);
    }
    dimension_index = dimension_index + 1;
    if (dimension_index == 9) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)example_structure_object._M_dataplus._M_p != &example_structure_object.field_2) {
        operator_delete(example_structure_object._M_dataplus._M_p,
                        example_structure_object.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)example_structure_definition._M_dataplus._M_p != &example_structure_definition.field_2)
      {
        operator_delete(example_structure_definition._M_dataplus._M_p,
                        example_structure_definition.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void ConstructorsAndUnsizedDeclStructConstructors<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string example_structure_definition("struct light {\n"
											 "    float intensity;\n"
											 "    int position;\n"
											 "};\n");
	std::string example_structure_object("    light my_light_variable");

	for (size_t max_dimension_index = 2; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		std::string base_variable_string = this->extend_string(example_structure_object, "[]", max_dimension_index);
		base_variable_string += " = ";
		base_variable_string += recursively_initialise("light", max_dimension_index, "1.0, 2");
		base_variable_string += ";\n\n";

		std::string shader_source = example_structure_definition + shader_start + base_variable_string;

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int max_dimension_index = 2; ...) */
}